

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O1

BasicStridedBitArrayView<1U,_const_char> * __thiscall
Corrade::Containers::StridedArrayView<1U,_const_bool>::sliceBit
          (BasicStridedBitArrayView<1U,_const_char> *__return_storage_ptr__,
          StridedArrayView<1U,_const_bool> *this,size_t index)

{
  ulong uVar1;
  long lVar2;
  ostream *poVar3;
  Debug *pDVar4;
  Error EStack_38;
  
  if (index < 8) {
    uVar1 = (this->_size)._data[0];
    if (uVar1 >> 0x3d == 0) {
      lVar2 = (this->_stride)._data[0];
      __return_storage_ptr__->_data = this->_data;
      (__return_storage_ptr__->_sizeOffset)._data[0] = index + uVar1 * 8;
      (__return_storage_ptr__->_stride)._data[0] = lVar2 << 3;
      return __return_storage_ptr__;
    }
    poVar3 = Utility::Error::defaultOutput();
    Utility::Error::Error(&EStack_38,poVar3,(Flags)0x0);
    pDVar4 = Utility::Debug::operator<<
                       (&EStack_38.super_Debug,
                        "Containers::StridedArrayView::sliceBit(): size expected to be smaller than 2^"
                       );
    (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
    pDVar4 = Utility::Debug::operator<<(pDVar4,0x3d);
    pDVar4 = Utility::Debug::operator<<(pDVar4,"bits, got");
    Utility::operator<<<Corrade::Containers::StridedDimensions<1U,_unsigned_long>,_0>
              (pDVar4,&this->_size);
  }
  else {
    poVar3 = Utility::Error::defaultOutput();
    Utility::Error::Error(&EStack_38,poVar3,(Flags)0x0);
    pDVar4 = Utility::Debug::operator<<
                       (&EStack_38.super_Debug,"Containers::StridedArrayView::sliceBit(): index");
    pDVar4 = Utility::Debug::operator<<(pDVar4,index);
    pDVar4 = Utility::Debug::operator<<(pDVar4,"out of range for a");
    pDVar4 = Utility::Debug::operator<<(pDVar4,8);
    (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
    Utility::Debug::operator<<(pDVar4,"-bit type");
  }
  Utility::Error::~Error(&EStack_38);
  abort();
}

Assistant:

auto StridedArrayView<dimensions, T>::sliceBit(const std::size_t index) const -> BasicStridedBitArrayView<dimensions, ArithmeticType> {
    /* Unlike plain slice(begin, end), complex member slicing is usually not
       called in tight loops and should be as checked as possible, so it's not
       a debug assert */
    CORRADE_ASSERT(index < sizeof(T)*8,
        "Containers::StridedArrayView::sliceBit(): index" << index << "out of range for a" << sizeof(T)*8 << Utility::Debug::nospace << "-bit type", {});

    /* Put the size in the upper bits, convert the stride from bytes to bits
       (which, well, is the same operation, HA) */
    Containers::Size<dimensions> sizeOffset{Corrade::NoInit};
    Containers::Stride<dimensions> stride{Corrade::NoInit};
    for(std::size_t i = 0; i != dimensions; ++i) {
        /* All asserts related to BitArray size limits are debug so make this
           one debug as well */
        CORRADE_DEBUG_ASSERT(_size._data[i] < std::size_t{1} << (sizeof(std::size_t)*8 - 3),
            "Containers::StridedArrayView::sliceBit(): size expected to be smaller than 2^" << Utility::Debug::nospace << (sizeof(std::size_t)*8 - 3) << "bits, got" << _size, {});
        sizeOffset._data[i] = _size._data[i] << 3;
        stride._data[i] = _stride._data[i] << 3;
    }

    /* Data pointer is whole bytes */
    ArithmeticType* const data = static_cast<ArithmeticType*>(_data) + (index >> 3);

    /* Offset is the remaining bits in the last byte */
    sizeOffset._data[0] |= index & 0x07;

    /* Using a (friended) private constructor as that's significantly easier
       than going through the public constructors that require a sized
       contiguous view for safety. */
    return BasicStridedBitArrayView<dimensions, ArithmeticType>{sizeOffset, stride, data};
}